

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

void x86SatisfyJumps(FastVector<unsigned_char_*,_false,_false> *instPos)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uchar **ppuVar9;
  
  if (pendingJumps.count != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pcVar3 = *(char **)((long)&(pendingJumps.data)->labelID + lVar4);
      cVar1 = *pcVar3;
      uVar6 = *(uint *)((long)pendingJumps.data + lVar4 + -8);
      uVar8 = (ulong)uVar6;
      if (*(char *)((long)pendingJumps.data + lVar4 + -4) == '\x01') {
        uVar6 = uVar6 & 0xffffff;
        uVar8 = (ulong)uVar6;
        uVar2 = instPos->count;
        if (cVar1 == '\x0f') {
          if (uVar2 <= uVar6) goto LAB_001d0943;
          iVar7 = (*(int *)(instPos->data + uVar8) - (int)pcVar3) + -6;
LAB_001d0906:
          *(int *)(pcVar3 + 2) = iVar7;
        }
        else {
          if (cVar1 == -0x73) {
            if (uVar2 <= uVar6) goto LAB_001d0943;
            ppuVar9 = instPos->data;
            goto LAB_001d08ed;
          }
          if (cVar1 == -0x18) {
            if (uVar2 <= uVar6) goto LAB_001d0943;
            ppuVar9 = instPos->data;
          }
          else {
            if (uVar2 <= uVar6) goto LAB_001d0943;
            ppuVar9 = instPos->data;
          }
LAB_001d0915:
          *(int *)(pcVar3 + 1) = (*(int *)(ppuVar9 + uVar8) - (int)pcVar3) + -5;
        }
      }
      else {
        if (cVar1 == -0x73) {
          ppuVar9 = labels.data;
          if (labels.count <= uVar6) goto LAB_001d0943;
LAB_001d08ed:
          iVar7 = *(int *)(ppuVar9 + uVar8);
          goto LAB_001d0906;
        }
        if (cVar1 == -0x18) {
          ppuVar9 = labels.data;
          if (labels.count <= uVar6) goto LAB_001d0943;
          goto LAB_001d0915;
        }
        if (labels.count <= uVar6) {
LAB_001d0943:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if (0x7f < (long)pcVar3 - (long)labels.data[uVar8]) {
          __assert_fail("uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                        ,0x964,"void x86SatisfyJumps(FastVector<unsigned char *> &)");
        }
        pcVar3[1] = ((char)labels.data[uVar8] - (char)pcVar3) + -2;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < pendingJumps.count);
  }
  pendingJumps.count = 0;
  return;
}

Assistant:

void x86SatisfyJumps(FastVector<unsigned char*>& instPos)
{
	for(unsigned int i = 0; i < pendingJumps.size(); i++)
	{
		UnsatisfiedJump& uJmp = pendingJumps[i];
		if(uJmp.isNear)
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(instPos[uJmp.labelID & 0x00ffffff]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				if(*uJmp.jmpPos == 0x0f)
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-6);
					memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
				}
				else
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
					memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
				}
			}
		}
		else
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(labels[uJmp.labelID] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(labels[uJmp.labelID]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				assert(uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256);
				*(char*)(uJmp.jmpPos+1) = (char)(labels[uJmp.labelID] - uJmp.jmpPos-2);
			}
		}
	}
	pendingJumps.clear();
}